

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void RunDeadCodeElimiation(ExpressionContext *ctx,VmModule *module,VmBlock *block)

{
  VmInstruction *pVVar1;
  VmInstruction *inst;
  bool bVar2;
  
  if (((block->super_VmValue).users.count == 0) &&
     (ctx = (ExpressionContext *)block, bVar2 = VmBlock::HasExternalInstructionUsers(block), !bVar2)
     ) {
    module->deadCodeEliminations = module->deadCodeEliminations + 1;
    VmFunction::RemoveBlock(block->parent,block);
    return;
  }
  inst = block->firstInstruction;
  while (inst != (VmInstruction *)0x0) {
    pVVar1 = inst->nextSibling;
    RunDeadCodeElimiation(ctx,module,inst);
    inst = pVVar1;
  }
  return;
}

Assistant:

void RunDeadCodeElimiation(ExpressionContext &ctx, VmModule *module, VmBlock *block)
{
	if(block->users.empty() && !block->HasExternalInstructionUsers())
	{
		module->deadCodeEliminations++;

		block->parent->RemoveBlock(block);
	}
	else
	{
		VmInstruction *curr = block->firstInstruction;

		while(curr)
		{
			VmInstruction *next = curr->nextSibling;
			RunDeadCodeElimiation(ctx, module, curr);
			curr = next;
		}
	}
}